

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.cpp
# Opt level: O2

void __thiscall InliningThreshold::SetHeuristics(InliningThreshold *this)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  
  iVar2 = DAT_0143c014;
  this->inlineThreshold = DAT_0143c014;
  uVar1 = this->nonLoadByteCodeCount;
  if (uVar1 < 0x321) {
    if (uVar1 < 0xc9) {
      if (0x31 < uVar1) goto LAB_0051378e;
      iVar2 = iVar2 + DAT_0143c028;
    }
    else {
      iVar2 = iVar2 - DAT_0143c024;
    }
  }
  else {
    iVar2 = iVar2 - DAT_0143c020;
  }
  this->inlineThreshold = iVar2;
LAB_0051378e:
  if (this->asmjs == true) {
    this->inlineThreshold = iVar2 + DAT_0143c02c;
  }
  this->constructorInlineThreshold = DAT_014303dc;
  this->outsideLoopInlineThreshold = DAT_0143ef14;
  uVar3 = (undefined4)_DAT_0143eee8;
  this->leafInlineThreshold = (int)((ulong)_DAT_0143eee8 >> 0x20);
  this->loopInlineThreshold = uVar3;
  this->polymorphicInlineThreshold = DAT_01441dc0;
  this->maxNumberOfInlineesWithLoop = DAT_0143ef1c;
  this->constantArgumentInlineThreshold = DAT_0143eef0;
  this->inlineCountMax = (&DAT_0143c000)[this->forLoopBody];
  return;
}

Assistant:

void InliningThreshold::SetHeuristics()
{
    inlineThreshold = CONFIG_FLAG(InlineThreshold);
    // Inline less aggressively in large functions since the register pressure is likely high.
    // Small functions shouldn't be a problem.
    if (nonLoadByteCodeCount > 800)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInLargeFunction);
    }
    else if (nonLoadByteCodeCount > 200)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInMediumSizedFunction);
    }
    else if (nonLoadByteCodeCount < 50)
    {
        inlineThreshold += CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
    }
    if (this->asmjs)
    {
        inlineThreshold += CONFIG_FLAG(AsmJsInlineAdjust);
    }

    constructorInlineThreshold = CONFIG_FLAG(ConstructorInlineThreshold);
    outsideLoopInlineThreshold = CONFIG_FLAG(OutsideLoopInlineThreshold);
    leafInlineThreshold = CONFIG_FLAG(LeafInlineThreshold);
    loopInlineThreshold = CONFIG_FLAG(LoopInlineThreshold);
    polymorphicInlineThreshold = CONFIG_FLAG(PolymorphicInlineThreshold);
    maxNumberOfInlineesWithLoop = CONFIG_FLAG(MaxNumberOfInlineesWithLoop);
    constantArgumentInlineThreshold = CONFIG_FLAG(ConstantArgumentInlineThreshold);
    inlineCountMax = !forLoopBody ? CONFIG_FLAG(InlineCountMax) : CONFIG_FLAG(InlineCountMaxInLoopBodies);
}